

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

int __thiscall
CVmObjDict::getp_is_defined(CVmObjDict *this,vm_obj_id_t self,vm_val_t *val,uint *argc)

{
  ushort uVar1;
  vm_val_t *pvVar2;
  int iVar3;
  uint hash;
  ushort *puVar4;
  vm_val_t *this_00;
  uint uVar5;
  vm_val_t filter;
  isdef_ctx ctx;
  
  if (getp_is_defined(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_is_defined(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_is_defined::desc.min_argc_ = 1;
      getp_is_defined::desc.opt_argc_ = 1;
      getp_is_defined::desc.varargs_ = 0;
      __cxa_guard_release(&getp_is_defined(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  if (argc == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *argc;
  }
  iVar3 = CVmObject::get_prop_check_argc(val,argc,&getp_is_defined::desc);
  pvVar2 = sp_;
  if (iVar3 == 0) {
    this_00 = sp_ + -1;
    puVar4 = (ushort *)vm_val_t::get_as_string(this_00);
    if (puVar4 == (ushort *)0x0) {
      err_throw(0x7e3);
    }
    uVar1 = *puVar4;
    if (uVar5 < 2) {
      filter.typ = VM_NIL;
    }
    else {
      filter.typ = sp_[-2].typ;
      filter._4_4_ = *(undefined4 *)&sp_[-2].field_0x4;
      filter.val = sp_[-2].val;
    }
    hash = calc_str_hash(this,this_00,(char *)(puVar4 + 1),(ulong)uVar1);
    ctx.globals = (vm_globals *)0x0;
    ctx.found = 0;
    ctx.strval.typ = this_00->typ;
    ctx.strval._4_4_ = *(undefined4 *)&this_00->field_0x4;
    ctx.strval.val = pvVar2[-1].val;
    ctx.filter_func = &filter;
    ctx.strp = (char *)(puVar4 + 1);
    ctx.strl = (ulong)uVar1;
    ctx.dict = this;
    vm_rcdesc::init(&ctx.rc,(EVP_PKEY_CTX *)"Dict.isDefined");
    CVmHashTable::enum_hash_matches
              (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),hash,isdef_cb,&ctx);
    val->typ = VM_TRUE - (ctx.found == 0);
    sp_ = sp_ + -(long)(int)uVar5;
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_is_defined(VMG_ vm_obj_id_t self, vm_val_t *val,
                                uint *argc)
{
    static CVmNativeCodeDesc desc(1, 1);
    uint orig_argc = (argc == 0 ? 0 : *argc);
    vm_val_t *arg0;
    const char *strp;
    size_t strl;
    vm_val_t filter;
    unsigned int hash;
    
    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* 
     *   make sure the argument is a string, but leave it on the stack for
     *   gc protection 
     */
    arg0 = G_stk->get(0);
    if ((strp = arg0->get_as_string(vmg0_)) == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* read and skip the string's length prefix */
    strl = vmb_get_len(strp);
    strp += VMB_LEN;

    /* if there's a second argument, it's the filter function */
    if (orig_argc >= 2)
    {
        /* retrieve the filter */
        filter = *G_stk->get(1);
    }
    else
    {
        /* there's no filter */
        filter.set_nil();
    }

    /* calculate the hash code */
    hash = calc_str_hash(vmg_ arg0, strp, strl);

    /* enumerate matches for the string */
    isdef_ctx ctx(vmg_ this, &filter, arg0, strp, strl);
    ctx.rc.init(vmg_ "Dict.isDefined", self, 5, arg0, orig_argc);
    get_ext()->hashtab_->enum_hash_matches(hash, &isdef_cb, &ctx);

    /* if we found any matches, return true; otherwise, return nil */
    val->set_logical(ctx.found);

    /* discard arguments */
    G_stk->discard(orig_argc);

    /* success */
    return TRUE;
}